

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O2

BOOLEAN __thiscall BVStatic<16UL>::Test(BVStatic<16UL> *this,BVIndex i)

{
  BOOLEAN BVar1;
  BVUnit *this_00;
  
  AssertRange(this,i);
  this_00 = BitsFromIndex(this,i);
  BVar1 = BVUnitT<unsigned_long>::Test(this_00,i & 0x3f);
  return BVar1;
}

Assistant:

BOOLEAN Test(BVIndex i) const
    {
        AssertRange(i);
        return this->BitsFromIndex(i)->Test(BVUnit::Offset(i));
    }